

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O2

void __thiscall QFbCursor::changeCursor(QFbCursor *this,QCursor *widgetCursor,QWindow *window)

{
  char cVar1;
  CursorShape shape;
  undefined8 uVar2;
  long in_FS_OFFSET;
  QRect QVar3;
  QPoint local_68;
  QRect local_60;
  QRect local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this[0x10] != (QFbCursor)0x1) goto LAB_00119ad9;
  if (widgetCursor == (QCursor *)0x0) {
    shape = ArrowCursor;
LAB_00119a64:
    setCursor(this,shape);
  }
  else {
    shape = QCursor::shape();
    if (shape != BitmapCursor) goto LAB_00119a64;
    uVar2 = QCursor::hotSpot();
    QCursor::pixmap();
    QPixmap::toImage();
    setCursor(this,(QImage *)&local_48,(int)uVar2,(int)((ulong)uVar2 >> 0x20));
    QImage::~QImage((QImage *)&local_48);
    QPixmap::~QPixmap((QPixmap *)&local_60);
  }
  QVar3 = getCurrentRect(this);
  *(QRect *)(this + 0x20) = QVar3;
  local_68 = (QPoint)(**(code **)(**(long **)(this + 0x18) + 0x68))();
  if (this[0x41] == (QFbCursor)0x0) {
    local_48 = (QRect)(**(code **)(**(long **)(this + 0x18) + 0x68))();
    local_60 = QRect::translated((QRect *)(this + 0x20),&local_68);
    cVar1 = QRect::intersects(&local_48);
    if (cVar1 == '\0') goto LAB_00119ad9;
  }
  (**(code **)(*(long *)this + 0xa0))(this);
LAB_00119ad9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFbCursor::changeCursor(QCursor * widgetCursor, QWindow *window)
{
    Q_UNUSED(window);
    if (!mVisible)
        return;
    const Qt::CursorShape shape = widgetCursor ? widgetCursor->shape() : Qt::ArrowCursor;

    if (shape == Qt::BitmapCursor) {
        // application supplied cursor
        QPoint spot = widgetCursor->hotSpot();
        setCursor(widgetCursor->pixmap().toImage(), spot.x(), spot.y());
    } else {
        // system cursor
        setCursor(shape);
    }
    mCurrentRect = getCurrentRect();
    QPoint mScreenOffset = mScreen->geometry().topLeft(); // global to local translation
    if (mOnScreen || mScreen->geometry().intersects(mCurrentRect.translated(mScreenOffset)))
        setDirty();
}